

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode Curl_update_timer(Curl_multi *multi)

{
  CURLMcode CVar1;
  int iVar2;
  timediff_t tVar3;
  bool bVar4;
  curltime older;
  curltime newer;
  _Bool set_value;
  long lStack_30;
  int rc;
  long timeout_ms;
  curltime expire_ts;
  Curl_multi *multi_local;
  
  bVar4 = false;
  if (((multi->timer_cb != (curl_multi_timer_callback)0x0) &&
      (((byte)multi->field_0x271 >> 4 & 1) == 0)) &&
     (expire_ts._8_8_ = multi,
     CVar1 = multi_timeout(multi,(curltime *)&timeout_ms,&stack0xffffffffffffffd0),
     CVar1 == CURLM_OK)) {
    if ((-1 < lStack_30) || (-1 < *(long *)(expire_ts._8_8_ + 0x248))) {
      if (lStack_30 < 0) {
        lStack_30 = -1;
        bVar4 = true;
      }
      else if (*(long *)(expire_ts._8_8_ + 0x248) < 0) {
        bVar4 = true;
      }
      else {
        older.tv_usec = (undefined4)expire_ts.tv_sec;
        older.tv_sec = timeout_ms;
        older._12_4_ = 0;
        newer._12_4_ = 0;
        newer._0_12_ = *(undefined1 (*) [12])(expire_ts._8_8_ + 0x250);
        tVar3 = Curl_timediff_us(newer,older);
        bVar4 = tVar3 != 0;
      }
    }
    if (bVar4) {
      *(long *)(expire_ts._8_8_ + 0x250) = timeout_ms;
      *(ulong *)(expire_ts._8_8_ + 600) =
           CONCAT44(expire_ts.tv_sec._4_4_,(undefined4)expire_ts.tv_sec);
      *(long *)(expire_ts._8_8_ + 0x248) = lStack_30;
      set_in_callback((Curl_multi *)expire_ts._8_8_,true);
      iVar2 = (**(code **)(expire_ts._8_8_ + 0x238))
                        (expire_ts._8_8_,lStack_30,*(undefined8 *)(expire_ts._8_8_ + 0x240));
      set_in_callback((Curl_multi *)expire_ts._8_8_,false);
      if (iVar2 == -1) {
        *(byte *)(expire_ts._8_8_ + 0x271) = *(byte *)(expire_ts._8_8_ + 0x271) & 0xef | 0x10;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_update_timer(struct Curl_multi *multi)
{
  struct curltime expire_ts;
  long timeout_ms;
  int rc;
  bool set_value = FALSE;

  if(!multi->timer_cb || multi->dead)
    return CURLM_OK;
  if(multi_timeout(multi, &expire_ts, &timeout_ms)) {
    return CURLM_OK;
  }

  if(timeout_ms < 0 && multi->last_timeout_ms < 0) {
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), still no timeout, no change\n");
#endif
  }
  else if(timeout_ms < 0) {
    /* there is no timeout now but there was one previously */
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), remove timeout, "
        " last_timeout=%ldms\n", multi->last_timeout_ms);
#endif
    timeout_ms = -1; /* normalize */
    set_value = TRUE;
  }
  else if(multi->last_timeout_ms < 0) {
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), had no timeout, set now\n");
#endif
    set_value = TRUE;
  }
  else if(Curl_timediff_us(multi->last_expire_ts, expire_ts)) {
    /* We had a timeout before and have one now, the absolute timestamp
     * differs. The relative timeout_ms may be the same, but the starting
     * point differs. Let the application restart its timer. */
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), expire timestamp changed\n");
#endif
    set_value = TRUE;
  }
  else {
    /* We have same expire time as previously. Our relative 'timeout_ms'
     * may be different now, but the application has the timer running
     * and we do not to tell it to start this again. */
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), same expire timestamp, no change\n");
#endif
  }

  if(set_value) {
#if DEBUG_UPDATE_TIMER
    fprintf(stderr, "Curl_update_timer(), set timeout %ldms\n", timeout_ms);
#endif
    multi->last_expire_ts = expire_ts;
    multi->last_timeout_ms = timeout_ms;
    set_in_callback(multi, TRUE);
    rc = multi->timer_cb(multi, timeout_ms, multi->timer_userp);
    set_in_callback(multi, FALSE);
    if(rc == -1) {
      multi->dead = TRUE;
      return CURLM_ABORTED_BY_CALLBACK;
    }
  }
  return CURLM_OK;
}